

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int XMLNode_search_attribute(XMLNode *node,SXML_CHAR *attr_name,int i_search)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if ((((attr_name != (SXML_CHAR *)0x0 && node != (XMLNode *)0x0) && (-1 < i_search)) &&
      (*attr_name != '\0')) && (iVar1 = node->n_attributes, i_search < iVar1)) {
    piVar3 = &node->attributes[(uint)i_search].active;
    do {
      if ((*piVar3 != 0) &&
         (iVar2 = strcmp(((XMLAttribute *)(piVar3 + -4))->name,attr_name), iVar2 == 0)) {
        return i_search;
      }
      i_search = i_search + 1;
      piVar3 = piVar3 + 6;
    } while (i_search < iVar1);
  }
  return -1;
}

Assistant:

int XMLNode_search_attribute(const XMLNode* node, const SXML_CHAR* attr_name, int i_search)
{
	int i;
	
	if (node == NULL || attr_name == NULL || attr_name[0] == NULC || i_search < 0 || i_search >= node->n_attributes)
		return -1;
	
	for (i = i_search; i < node->n_attributes; i++)
		if (node->attributes[i].active && !sx_strcmp(node->attributes[i].name, attr_name))
			return i;
	
	return -1;
}